

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_CAPABILITY_DATA_Unmarshal(TPMS_CAPABILITY_DATA *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPM_CAP_Unmarshal(&target->capability,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMU_CAPABILITIES_Unmarshal(&target->data,buffer,size,target->capability);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_CAPABILITY_DATA_Unmarshal(TPMS_CAPABILITY_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_CAP_Unmarshal((TPM_CAP *)&(target->capability), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_CAPABILITIES_Unmarshal((TPMU_CAPABILITIES *)&(target->data), buffer, size, (UINT32)target->capability);
    return result;
}